

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool google::protobuf::internal::cpp::IsGroupLike(FieldDescriptor *field)

{
  byte bVar1;
  ushort *puVar2;
  ushort *puVar3;
  bool bVar4;
  Descriptor *pDVar5;
  Descriptor *pDVar6;
  char *in_RCX;
  lts_20250127 *this;
  ulong uVar7;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view s;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string local_48;
  
  if (field->type_ != '\n') {
    return false;
  }
  puVar2 = (ushort *)(field->all_names_).payload_;
  uVar7 = (ulong)*puVar2;
  pDVar5 = FieldDescriptor::message_type(field);
  puVar3 = (ushort *)(pDVar5->all_names_).payload_;
  this = (lts_20250127 *)(ulong)*puVar3;
  s._M_len = (long)puVar3 + ~(ulong)this;
  s._M_str = in_RCX;
  absl::lts_20250127::AsciiStrToLower_abi_cxx11_(&local_48,this,s);
  __x._M_str = (char *)((long)puVar2 + ~uVar7);
  __x._M_len = uVar7;
  __y._M_str = local_48._M_dataplus._M_p;
  __y._M_len = local_48._M_string_length;
  bVar4 = std::operator!=(__x,__y);
  std::__cxx11::string::~string((string *)&local_48);
  if ((!bVar4) && (pDVar5 = FieldDescriptor::message_type(field), pDVar5->file_ == field->file_)) {
    bVar1 = field->field_0x1;
    pDVar5 = FieldDescriptor::message_type(field);
    pDVar5 = pDVar5->containing_type_;
    if ((bVar1 & 8) == 0) {
      pDVar6 = field->containing_type_;
    }
    else {
      pDVar6 = FieldDescriptor::extension_scope(field);
    }
    return pDVar5 == pDVar6;
  }
  return false;
}

Assistant:

bool IsGroupLike(const FieldDescriptor& field) {
  // Groups are always tag-delimited, currently specified by a TYPE_GROUP type.
  if (field.type() != FieldDescriptor::TYPE_GROUP) return false;
  // Group fields always are always the lowercase type name.
  if (field.name() != absl::AsciiStrToLower(field.message_type()->name())) {
    return false;
  }

  if (field.message_type()->file() != field.file()) return false;

  // Group messages are always defined in the same scope as the field.  File
  // level extensions will compare NULL == NULL here, which is why the file
  // comparison above is necessary to ensure both come from the same file.
  return field.is_extension() ? field.message_type()->containing_type() ==
                                    field.extension_scope()
                              : field.message_type()->containing_type() ==
                                    field.containing_type();
}